

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTDMT_initCStream_internal
                 (ZSTDMT_CCtx *mtctx,void *dict,size_t dictSize,
                 ZSTD_dictContentType_e dictContentType,ZSTD_CDict *cdict,ZSTD_CCtx_params params,
                 unsigned_long_long pledgedSrcSize)

{
  ZSTD_customMem customMem;
  ZSTD_customMem customMem_00;
  ZSTD_compressionParameters cParams;
  ZSTD_CCtx_params params_00;
  ZSTD_compressionParameters cParams_00;
  ZSTD_customMem customMem_01;
  uint uVar1;
  int iVar2;
  size_t sVar3;
  ZSTD_CDict *pZVar4;
  U64 UVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  void *pvVar11;
  long lVar12;
  long lVar13;
  long in_RSI;
  undefined8 *puVar14;
  long in_RDI;
  undefined8 *puVar15;
  long in_R8;
  undefined8 in_R9;
  byte bVar16;
  size_t in_stack_0000000c;
  ZSTDMT_CCtx *in_stack_00000014;
  ZSTDMT_CCtx *in_stack_0000001c;
  undefined4 in_stack_00000024;
  size_t capacity;
  size_t sectionsSize;
  size_t nbWorkers;
  size_t slackSize;
  size_t nbSlackBuffers;
  size_t windowSize;
  U32 rsyncBits;
  U32 jobSizeKB;
  size_t err_code;
  size_t bSize;
  ZSTDMT_CCtx *mtctx_00;
  undefined4 uVar17;
  undefined4 in_stack_fffffffffffffe44;
  undefined8 in_stack_fffffffffffffe48;
  void *in_stack_fffffffffffffe50;
  ZSTD_strategy in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe5c;
  ZSTDMT_CCtx *in_stack_fffffffffffffe80;
  ZSTD_dictContentType_e in_stack_fffffffffffffe94;
  size_t in_stack_fffffffffffffe98;
  void *in_stack_fffffffffffffea0;
  size_t in_stack_fffffffffffffea8;
  ZSTDMT_seqPool *in_stack_fffffffffffffeb0;
  serialState_t *in_stack_fffffffffffffeb8;
  undefined1 auVar18 [28];
  undefined1 auVar19 [12];
  undefined1 in_stack_fffffffffffffed0 [48];
  undefined8 uVar20;
  ulong uVar21;
  ZSTD_dictContentType_e in_stack_ffffffffffffff20;
  ZSTD_dictLoadMethod_e in_stack_ffffffffffffff24;
  size_t in_stack_ffffffffffffff28;
  undefined8 uVar22;
  void *in_stack_ffffffffffffff30;
  ulong uVar23;
  ulong uVar24;
  undefined8 *__src;
  undefined8 in_stack_ffffffffffffff48;
  undefined8 in_stack_ffffffffffffff50;
  ZSTD_strategy in_stack_ffffffffffffff58;
  int iVar25;
  int iVar26;
  undefined8 in_stack_ffffffffffffff60;
  undefined8 in_stack_ffffffffffffff68;
  void *in_stack_ffffffffffffff70;
  uint in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  size_t in_stack_ffffffffffffff80;
  ZSTDMT_CCtx *in_stack_ffffffffffffff88;
  undefined8 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  size_t local_8;
  
  bVar16 = 0;
  __src = (undefined8 *)&stack0x00000008;
  cParams.chainLog = in_stack_fffffffffffffe44;
  cParams.windowLog = in_stack_00000024;
  cParams._8_8_ = in_stack_fffffffffffffe48;
  cParams._16_8_ = in_stack_fffffffffffffe50;
  cParams.strategy = in_stack_fffffffffffffe58;
  ZSTD_checkCParams(cParams);
  uVar1 = ZSTD_isError(0x2edda9);
  if (uVar1 != 0) {
    __assert_fail("!ZSTD_isError(ZSTD_checkCParams(params.cParams))",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x89b3,
                  "size_t ZSTDMT_initCStream_internal(ZSTDMT_CCtx *, const void *, size_t, ZSTD_dictContentType_e, const ZSTD_CDict *, ZSTD_CCtx_params, unsigned long long)"
                 );
  }
  if ((in_RSI != 0) && (in_R8 != 0)) {
    __assert_fail("!((dict) && (cdict))",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x89b4,
                  "size_t ZSTDMT_initCStream_internal(ZSTDMT_CCtx *, const void *, size_t, ZSTD_dictContentType_e, const ZSTD_CDict *, ZSTD_CCtx_params, unsigned long long)"
                 );
  }
  bSize = in_stack_0000000c;
  mtctx_00 = in_stack_00000014;
  uVar17 = in_stack_00000024;
  if (*(int *)((long)__src + 0x4c) != *(int *)(in_RDI + 0x74)) {
    sVar3 = ZSTDMT_resize(in_stack_0000001c,(uint)((ulong)in_stack_00000014 >> 0x20));
    uVar1 = ERR_isError(sVar3);
    bSize = in_stack_0000000c;
    mtctx_00 = in_stack_00000014;
    uVar17 = in_stack_00000024;
    if (uVar1 != 0) {
      return sVar3;
    }
  }
  if ((__src[10] != 0) && ((ulong)__src[10] < 0x80000)) {
    __src[10] = 0x80000;
  }
  uVar24 = __src[10];
  uVar1 = MEM_32bits();
  iVar2 = 0x40000000;
  if (uVar1 != 0) {
    iVar2 = 0x20000000;
  }
  if ((ulong)(long)iVar2 < uVar24) {
    uVar1 = MEM_32bits();
    iVar2 = 0x40000000;
    if (uVar1 != 0) {
      iVar2 = 0x20000000;
    }
    __src[10] = (long)iVar2;
  }
  if (*(int *)(in_RDI + 0xbc0) == 0) {
    ZSTDMT_waitForAllJobsCompleted(mtctx_00);
    ZSTDMT_releaseAllJobResources(in_stack_fffffffffffffe80);
    *(undefined4 *)(in_RDI + 0xbc0) = 1;
  }
  memcpy((void *)(in_RDI + 0x28),__src,0xd0);
  *(undefined8 *)(in_RDI + 0xbc8) = in_R9;
  if (in_RSI == 0) {
    ZSTD_freeCDict((ZSTD_CDict *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    *(undefined8 *)(in_RDI + 0xbf8) = 0;
    *(long *)(in_RDI + 0xc00) = in_R8;
  }
  else {
    ZSTD_freeCDict((ZSTD_CDict *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    bSize = *(size_t *)((long)__src + 4);
    mtctx_00 = *(ZSTDMT_CCtx **)((long)__src + 0xc);
    in_stack_ffffffffffffff90 = *(undefined8 *)((long)__src + 0x14);
    uVar17 = *(undefined4 *)((long)__src + 0x1c);
    in_stack_fffffffffffffe48 = *(undefined8 *)(in_RDI + 0xbe0);
    in_stack_fffffffffffffe50 = *(void **)(in_RDI + 0xbe8);
    cParams_00.hashLog = (int)in_stack_ffffffffffffff48;
    cParams_00.searchLog = (int)((ulong)in_stack_ffffffffffffff48 >> 0x20);
    cParams_00._0_8_ = __src;
    cParams_00.minMatch = (int)in_stack_ffffffffffffff50;
    cParams_00.targetLength = (int)((ulong)in_stack_ffffffffffffff50 >> 0x20);
    cParams_00.strategy = in_stack_ffffffffffffff58;
    customMem_01.customFree = (ZSTD_freeFunction)in_stack_ffffffffffffff68;
    customMem_01.customAlloc = (ZSTD_allocFunction)in_stack_ffffffffffffff60;
    customMem_01.opaque = in_stack_ffffffffffffff70;
    in_stack_ffffffffffffff80 = bSize;
    in_stack_ffffffffffffff88 = mtctx_00;
    in_stack_ffffffffffffff98 = uVar17;
    pZVar4 = ZSTD_createCDict_advanced
                       (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                        in_stack_ffffffffffffff24,in_stack_ffffffffffffff20,cParams_00,customMem_01)
    ;
    *(ZSTD_CDict **)(in_RDI + 0xbf8) = pZVar4;
    *(undefined8 *)(in_RDI + 0xc00) = *(undefined8 *)(in_RDI + 0xbf8);
    if (*(long *)(in_RDI + 0xbf8) == 0) {
      return 0xffffffffffffffc0;
    }
  }
  sVar3 = ZSTDMT_computeOverlapSize((ZSTD_CCtx_params *)CONCAT44(in_stack_fffffffffffffe44,uVar17));
  *(size_t *)(in_RDI + 0x100) = sVar3;
  *(undefined8 *)(in_RDI + 0xf8) = __src[10];
  if (*(long *)(in_RDI + 0xf8) == 0) {
    uVar1 = ZSTDMT_computeTargetJobLog
                      ((ZSTD_CCtx_params *)CONCAT44(in_stack_fffffffffffffe44,uVar17));
    *(long *)(in_RDI + 0xf8) = 1L << ((byte)uVar1 & 0x3f);
  }
  uVar23 = *(ulong *)(in_RDI + 0xf8);
  uVar1 = MEM_32bits();
  iVar2 = 0x40000000;
  if (uVar1 != 0) {
    iVar2 = 0x20000000;
  }
  if (uVar23 <= (ulong)(long)iVar2) {
    if (*(int *)((long)__src + 0x5c) != 0) {
      in_stack_ffffffffffffff7c = (int)(*(ulong *)(in_RDI + 0xf8) >> 10);
      if (in_stack_ffffffffffffff7c == 0) {
        __assert_fail("jobSizeKB >= 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x89df,
                      "size_t ZSTDMT_initCStream_internal(ZSTDMT_CCtx *, const void *, size_t, ZSTD_dictContentType_e, const ZSTD_CDict *, ZSTD_CCtx_params, unsigned long long)"
                     );
      }
      in_stack_ffffffffffffff78 = ZSTD_highbit32(0);
      in_stack_ffffffffffffff78 = in_stack_ffffffffffffff78 + 10;
      if (in_stack_ffffffffffffff78 < 0x13) {
        __assert_fail("rsyncBits >= RSYNC_MIN_BLOCK_LOG + 2",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x89e2,
                      "size_t ZSTDMT_initCStream_internal(ZSTDMT_CCtx *, const void *, size_t, ZSTD_dictContentType_e, const ZSTD_CDict *, ZSTD_CCtx_params, unsigned long long)"
                     );
      }
      *(undefined8 *)(in_RDI + 0xb98) = 0;
      *(long *)(in_RDI + 0xba0) = (1L << ((byte)in_stack_ffffffffffffff78 & 0x3f)) + -1;
      UVar5 = ZSTD_rollingHash_primePower(0);
      *(U64 *)(in_RDI + 0xba8) = UVar5;
    }
    if (*(ulong *)(in_RDI + 0xf8) < *(ulong *)(in_RDI + 0x100)) {
      *(undefined8 *)(in_RDI + 0xf8) = *(undefined8 *)(in_RDI + 0x100);
    }
    uVar22 = *(undefined8 *)(in_RDI + 0x10);
    ZSTD_compressBound(*(size_t *)(in_RDI + 0xf8));
    ZSTDMT_setBufferSize((ZSTDMT_bufferPool *)mtctx_00,bSize);
    if (*(int *)(in_RDI + 0x88) == 1) {
      uVar1 = 1 << ((byte)*(undefined4 *)(in_RDI + 0x2c) & 0x1f);
    }
    else {
      uVar1 = 0;
    }
    uVar6 = (ulong)uVar1;
    lVar7 = (long)(int)((*(long *)(in_RDI + 0x100) != 0) + 2);
    lVar8 = *(long *)(in_RDI + 0xf8) * lVar7;
    if (*(int *)(in_RDI + 0x74) < 2) {
      iVar2 = 1;
    }
    else {
      iVar2 = *(int *)(in_RDI + 0x74);
    }
    iVar26 = iVar2 >> 0x1f;
    uVar9 = *(long *)(in_RDI + 0xf8) * (long)iVar2;
    uVar21 = uVar9;
    if (uVar9 < uVar6) {
      uVar21 = uVar6;
    }
    uVar10 = uVar21 + lVar8;
    iVar25 = iVar2;
    if (*(ulong *)(in_RDI + 0x140) < uVar10) {
      if (*(long *)(in_RDI + 0x138) != 0) {
        customMem.customAlloc._4_4_ = in_stack_fffffffffffffe44;
        customMem.customAlloc._0_4_ = uVar17;
        customMem.customFree = (ZSTD_freeFunction)in_stack_fffffffffffffe48;
        customMem.opaque = in_stack_fffffffffffffe50;
        ZSTD_customFree(*(void **)(in_RDI + 0xbe8),customMem);
      }
      customMem_00.customAlloc._4_4_ = in_stack_fffffffffffffe44;
      customMem_00.customAlloc._0_4_ = uVar17;
      customMem_00.customFree = (ZSTD_freeFunction)in_stack_fffffffffffffe48;
      customMem_00.opaque = in_stack_fffffffffffffe50;
      pvVar11 = ZSTD_customMalloc(*(size_t *)(in_RDI + 0xbe0),customMem_00);
      *(void **)(in_RDI + 0x138) = pvVar11;
      if (*(long *)(in_RDI + 0x138) == 0) {
        *(undefined8 *)(in_RDI + 0x140) = 0;
        return 0xffffffffffffffc0;
      }
      *(ulong *)(in_RDI + 0x140) = uVar10;
    }
    *(undefined8 *)(in_RDI + 0x148) = 0;
    *(void **)(in_RDI + 0x120) = (void *)0x0;
    *(size_t *)(in_RDI + 0x128) = 0;
    *(undefined8 *)(in_RDI + 0x130) = 0;
    *(void **)(in_RDI + 0x110) = (void *)0x0;
    *(size_t *)(in_RDI + 0x118) = 0;
    *(undefined4 *)(in_RDI + 0xbb4) = 0;
    *(undefined4 *)(in_RDI + 3000) = 0;
    *(undefined4 *)(in_RDI + 0xbbc) = 0;
    *(undefined4 *)(in_RDI + 0xbc0) = 0;
    *(undefined8 *)(in_RDI + 0xbd0) = 0;
    *(undefined8 *)(in_RDI + 0xbd8) = 0;
    lVar12 = in_RDI + 0x150;
    uVar20 = *(undefined8 *)(in_RDI + 0x20);
    puVar14 = __src;
    puVar15 = (undefined8 *)&stack0xfffffffffffffe28;
    for (lVar13 = 0x1a; lVar13 != 0; lVar13 = lVar13 + -1) {
      *puVar15 = *puVar14;
      puVar14 = puVar14 + (ulong)bVar16 * -2 + 1;
      puVar15 = puVar15 + (ulong)bVar16 * -2 + 1;
    }
    params_00._48_8_ = uVar20;
    auVar18 = in_stack_fffffffffffffed0._4_28_;
    auVar19 = in_stack_fffffffffffffed0._32_12_;
    params_00.format = in_stack_fffffffffffffed0._0_4_;
    params_00.cParams.windowLog = auVar18._0_4_;
    params_00.cParams.chainLog = auVar18._4_4_;
    params_00.cParams.hashLog = auVar18._8_4_;
    params_00.cParams.searchLog = auVar18._12_4_;
    params_00.cParams.minMatch = auVar18._16_4_;
    params_00.cParams.targetLength = auVar18._20_4_;
    params_00.cParams.strategy = auVar18._24_4_;
    params_00.fParams.contentSizeFlag = auVar19._0_4_;
    params_00.fParams.checksumFlag = auVar19._4_4_;
    params_00.fParams.noDictIDFlag = auVar19._8_4_;
    params_00.compressionLevel = in_stack_fffffffffffffed0._44_4_;
    params_00.targetCBlockSize = lVar12;
    params_00.srcSizeHint = (int)in_RSI;
    params_00.attachDictPref = (int)((ulong)in_RSI >> 0x20);
    params_00.literalCompressionMode = (int)uVar21;
    params_00.nbWorkers = (int)(uVar21 >> 0x20);
    params_00.jobSize._0_4_ = iVar2;
    params_00.jobSize._4_4_ = uVar1;
    params_00.overlapLog = (int)uVar22;
    params_00.rsyncable = (int)((ulong)uVar22 >> 0x20);
    params_00.ldmParams.enableLdm = (int)uVar23;
    params_00.ldmParams.hashLog = (int)(uVar23 >> 0x20);
    params_00.ldmParams.bucketSizeLog = (int)uVar24;
    params_00.ldmParams.minMatchLength = (int)(uVar24 >> 0x20);
    params_00.ldmParams._16_8_ = __src;
    params_00.enableDedicatedDictSearch = (int)uVar10;
    params_00.inBufferMode = (int)(uVar10 >> 0x20);
    params_00.outBufferMode = (int)uVar9;
    params_00.blockDelimiters = (int)(uVar9 >> 0x20);
    params_00.validateSequences = iVar25;
    params_00.useBlockSplitter = iVar26;
    params_00.useRowMatchFinder = (int)lVar8;
    params_00.deterministicRefPrefix = (int)((ulong)lVar8 >> 0x20);
    params_00.customMem.customAlloc = (ZSTD_allocFunction)lVar7;
    params_00.customMem.customFree = (ZSTD_freeFunction)uVar6;
    params_00.customMem.opaque._0_4_ = in_stack_ffffffffffffff78;
    params_00.customMem.opaque._4_4_ = in_stack_ffffffffffffff7c;
    params_00.prefetchCDictTables = (int)in_stack_ffffffffffffff80;
    params_00.enableMatchFinderFallback = (int)(in_stack_ffffffffffffff80 >> 0x20);
    params_00._184_8_ = in_stack_ffffffffffffff88;
    params_00.maxBlockSize = in_stack_ffffffffffffff90;
    params_00.searchForExternalRepcodes = in_stack_ffffffffffffff98;
    params_00._204_4_ = in_stack_ffffffffffffff9c;
    iVar2 = ZSTDMT_serialState_reset
                      (in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,params_00,
                       in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,in_stack_fffffffffffffe98
                       ,in_stack_fffffffffffffe94);
    if (iVar2 == 0) {
      local_8 = 0;
    }
    else {
      local_8 = 0xffffffffffffffc0;
    }
    return local_8;
  }
  __assert_fail("mtctx->targetSectionSize <= (size_t)ZSTDMT_JOBSIZE_MAX",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                ,0x89da,
                "size_t ZSTDMT_initCStream_internal(ZSTDMT_CCtx *, const void *, size_t, ZSTD_dictContentType_e, const ZSTD_CDict *, ZSTD_CCtx_params, unsigned long long)"
               );
}

Assistant:

size_t ZSTDMT_initCStream_internal(
        ZSTDMT_CCtx* mtctx,
        const void* dict, size_t dictSize, ZSTD_dictContentType_e dictContentType,
        const ZSTD_CDict* cdict, ZSTD_CCtx_params params,
        unsigned long long pledgedSrcSize)
{
    DEBUGLOG(4, "ZSTDMT_initCStream_internal (pledgedSrcSize=%u, nbWorkers=%u, cctxPool=%u)",
                (U32)pledgedSrcSize, params.nbWorkers, mtctx->cctxPool->totalCCtx);

    /* params supposed partially fully validated at this point */
    assert(!ZSTD_isError(ZSTD_checkCParams(params.cParams)));
    assert(!((dict) && (cdict)));  /* either dict or cdict, not both */

    /* init */
    if (params.nbWorkers != mtctx->params.nbWorkers)
        FORWARD_IF_ERROR( ZSTDMT_resize(mtctx, params.nbWorkers) , "");

    if (params.jobSize != 0 && params.jobSize < ZSTDMT_JOBSIZE_MIN) params.jobSize = ZSTDMT_JOBSIZE_MIN;
    if (params.jobSize > (size_t)ZSTDMT_JOBSIZE_MAX) params.jobSize = (size_t)ZSTDMT_JOBSIZE_MAX;

    DEBUGLOG(4, "ZSTDMT_initCStream_internal: %u workers", params.nbWorkers);

    if (mtctx->allJobsCompleted == 0) {   /* previous compression not correctly finished */
        ZSTDMT_waitForAllJobsCompleted(mtctx);
        ZSTDMT_releaseAllJobResources(mtctx);
        mtctx->allJobsCompleted = 1;
    }

    mtctx->params = params;
    mtctx->frameContentSize = pledgedSrcSize;
    if (dict) {
        ZSTD_freeCDict(mtctx->cdictLocal);
        mtctx->cdictLocal = ZSTD_createCDict_advanced(dict, dictSize,
                                                    ZSTD_dlm_byCopy, dictContentType, /* note : a loadPrefix becomes an internal CDict */
                                                    params.cParams, mtctx->cMem);
        mtctx->cdict = mtctx->cdictLocal;
        if (mtctx->cdictLocal == NULL) return ERROR(memory_allocation);
    } else {
        ZSTD_freeCDict(mtctx->cdictLocal);
        mtctx->cdictLocal = NULL;
        mtctx->cdict = cdict;
    }

    mtctx->targetPrefixSize = ZSTDMT_computeOverlapSize(&params);
    DEBUGLOG(4, "overlapLog=%i => %u KB", params.overlapLog, (U32)(mtctx->targetPrefixSize>>10));
    mtctx->targetSectionSize = params.jobSize;
    if (mtctx->targetSectionSize == 0) {
        mtctx->targetSectionSize = 1ULL << ZSTDMT_computeTargetJobLog(&params);
    }
    assert(mtctx->targetSectionSize <= (size_t)ZSTDMT_JOBSIZE_MAX);

    if (params.rsyncable) {
        /* Aim for the targetsectionSize as the average job size. */
        U32 const jobSizeKB = (U32)(mtctx->targetSectionSize >> 10);
        U32 const rsyncBits = (assert(jobSizeKB >= 1), ZSTD_highbit32(jobSizeKB) + 10);
        /* We refuse to create jobs < RSYNC_MIN_BLOCK_SIZE bytes, so make sure our
         * expected job size is at least 4x larger. */
        assert(rsyncBits >= RSYNC_MIN_BLOCK_LOG + 2);
        DEBUGLOG(4, "rsyncLog = %u", rsyncBits);
        mtctx->rsync.hash = 0;
        mtctx->rsync.hitMask = (1ULL << rsyncBits) - 1;
        mtctx->rsync.primePower = ZSTD_rollingHash_primePower(RSYNC_LENGTH);
    }
    if (mtctx->targetSectionSize < mtctx->targetPrefixSize) mtctx->targetSectionSize = mtctx->targetPrefixSize;  /* job size must be >= overlap size */
    DEBUGLOG(4, "Job Size : %u KB (note : set to %u)", (U32)(mtctx->targetSectionSize>>10), (U32)params.jobSize);
    DEBUGLOG(4, "inBuff Size : %u KB", (U32)(mtctx->targetSectionSize>>10));
    ZSTDMT_setBufferSize(mtctx->bufPool, ZSTD_compressBound(mtctx->targetSectionSize));
    {
        /* If ldm is enabled we need windowSize space. */
        size_t const windowSize = mtctx->params.ldmParams.enableLdm == ZSTD_ps_enable ? (1U << mtctx->params.cParams.windowLog) : 0;
        /* Two buffers of slack, plus extra space for the overlap
         * This is the minimum slack that LDM works with. One extra because
         * flush might waste up to targetSectionSize-1 bytes. Another extra
         * for the overlap (if > 0), then one to fill which doesn't overlap
         * with the LDM window.
         */
        size_t const nbSlackBuffers = 2 + (mtctx->targetPrefixSize > 0);
        size_t const slackSize = mtctx->targetSectionSize * nbSlackBuffers;
        /* Compute the total size, and always have enough slack */
        size_t const nbWorkers = MAX(mtctx->params.nbWorkers, 1);
        size_t const sectionsSize = mtctx->targetSectionSize * nbWorkers;
        size_t const capacity = MAX(windowSize, sectionsSize) + slackSize;
        if (mtctx->roundBuff.capacity < capacity) {
            if (mtctx->roundBuff.buffer)
                ZSTD_customFree(mtctx->roundBuff.buffer, mtctx->cMem);
            mtctx->roundBuff.buffer = (BYTE*)ZSTD_customMalloc(capacity, mtctx->cMem);
            if (mtctx->roundBuff.buffer == NULL) {
                mtctx->roundBuff.capacity = 0;
                return ERROR(memory_allocation);
            }
            mtctx->roundBuff.capacity = capacity;
        }
    }
    DEBUGLOG(4, "roundBuff capacity : %u KB", (U32)(mtctx->roundBuff.capacity>>10));
    mtctx->roundBuff.pos = 0;
    mtctx->inBuff.buffer = g_nullBuffer;
    mtctx->inBuff.filled = 0;
    mtctx->inBuff.prefix = kNullRange;
    mtctx->doneJobID = 0;
    mtctx->nextJobID = 0;
    mtctx->frameEnded = 0;
    mtctx->allJobsCompleted = 0;
    mtctx->consumed = 0;
    mtctx->produced = 0;
    if (ZSTDMT_serialState_reset(&mtctx->serial, mtctx->seqPool, params, mtctx->targetSectionSize,
                                 dict, dictSize, dictContentType))
        return ERROR(memory_allocation);
    return 0;
}